

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cpp
# Opt level: O3

Symbol * getSymbol(Symbol **symbolList,uint32_t index)

{
  Symbol *pSVar1;
  
  if (index == 0xffffffff) {
    __assert_fail("index != (uint32_t)-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/link/patch.cpp"
                  ,0x6b,"getSymbol");
  }
  pSVar1 = symbolList[index];
  if (pSVar1->type == SYMTYPE_IMPORT) {
    pSVar1 = sym_GetSymbol(pSVar1->name);
    return pSVar1;
  }
  return pSVar1;
}

Assistant:

static struct Symbol const *getSymbol(struct Symbol const * const *symbolList,
				      uint32_t index)
{
	assert(index != (uint32_t)-1); // PC needs to be handled specially, not here
	struct Symbol const *symbol = symbolList[index];

	// If the symbol is defined elsewhere...
	if (symbol->type == SYMTYPE_IMPORT)
		return sym_GetSymbol(symbol->name);

	return symbol;
}